

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O3

void Imf_2_5::calculateBytesPerLine
               (Header *header,char *sampleCountBase,int sampleCountXStride,int sampleCountYStride,
               int minX,int maxX,int minY,int maxY,vector<int,_std::allocator<int>_> *xOffsets,
               vector<int,_std::allocator<int>_> *yOffsets,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  ChannelList *this;
  const_iterator cVar7;
  const_iterator cVar8;
  ConstIterator CVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long local_80;
  
  this = Header::channels(header);
  cVar7._M_node = (_Base_ptr)ChannelList::begin(this);
  cVar8._M_node = (_Base_ptr)ChannelList::end(this);
  if (cVar7._M_node != cVar8._M_node) {
    local_80 = 0;
    do {
      if (minY <= maxY) {
        iVar2 = (yOffsets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_80];
        iVar3 = (xOffsets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_80];
        lVar13 = (long)(minX - iVar3);
        lVar10 = (long)(minY - iVar2);
        piVar11 = (int *)(sampleCountBase +
                         sampleCountYStride * lVar10 + sampleCountXStride * lVar13);
        lVar14 = 0;
        do {
          piVar12 = piVar11;
          lVar15 = lVar13 + -1;
          if (minX <= maxX) {
            do {
              iVar4 = *piVar12;
              iVar6 = pixelTypeSize(cVar7._M_node[9]._M_color);
              puVar1 = (bytesPerLine->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar14;
              *puVar1 = *puVar1 + (long)iVar6 * (long)iVar4;
              lVar15 = lVar15 + 1;
              piVar12 = (int *)((long)piVar12 + (long)sampleCountXStride);
            } while (lVar15 < maxX - iVar3);
          }
          lVar14 = lVar14 + 1;
          piVar11 = (int *)((long)piVar11 + (long)sampleCountYStride);
          bVar5 = lVar10 < maxY - iVar2;
          lVar10 = lVar10 + 1;
        } while (bVar5);
      }
      cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node);
      local_80 = local_80 + 1;
      CVar9 = ChannelList::end(this);
    } while ((const_iterator)cVar7._M_node != CVar9._i._M_node);
  }
  return;
}

Assistant:

void
calculateBytesPerLine (const Header &header,
                       char* sampleCountBase,
                       int sampleCountXStride,
                       int sampleCountYStride,
                       int minX, int maxX,
                       int minY, int maxY,
                       std::vector<int>& xOffsets,
                       std::vector<int>& yOffsets,
                       std::vector<Int64>& bytesPerLine)
{
    const ChannelList &channels = header.channels();

    int pos = 0;
    for (ChannelList::ConstIterator c = channels.begin();
         c != channels.end();
         ++c, ++pos)
    {
        int xOffset = xOffsets[pos];
        int yOffset = yOffsets[pos];
        int i = 0;
        for (int y = minY - yOffset; y <= maxY - yOffset; y++, i++)
            for (int x = minX - xOffset; x <= maxX - xOffset; x++)
            {
                bytesPerLine[i] += sampleCount(sampleCountBase,
                                               sampleCountXStride,
                                               sampleCountYStride,
                                               x, y)
                                   * pixelTypeSize (c.channel().type);
            }
    }
}